

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O2

int xlsxioread_sheet_next_cell_float(xlsxioreadersheet sheethandle,double *pvalue)

{
  int iVar1;
  XML_Char *__nptr;
  double dVar2;
  
  __nptr = xlsxioread_sheet_next_cell(sheethandle);
  if (__nptr == (XML_Char *)0x0) {
    iVar1 = 0;
  }
  else {
    if (pvalue != (double *)0x0) {
      dVar2 = strtod(__nptr,(char **)0x0);
      *pvalue = dVar2;
    }
    free(__nptr);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

DLL_EXPORT_XLSXIO int xlsxioread_sheet_next_cell_float (xlsxioreadersheet sheethandle, double* pvalue)
{
  XML_Char* result;
  if ((result = xlsxioread_sheet_next_cell(sheethandle)) == NULL)
    return 0;
  if (pvalue)
    *pvalue = XML_Char_tod(result);
  free(result);
  return 1;
}